

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder * __thiscall
capnp::_::PointerBuilder::initBlob<capnp::Text>
          (Builder *__return_storage_ptr__,PointerBuilder *this,ByteCount size)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  uint size_00;
  ThrowOverflow local_39;
  SegmentAnd<capnp::Text::Builder> local_38;
  ByteCount local_14;
  PointerBuilder *pPStack_10;
  ByteCount size_local;
  PointerBuilder *this_local;
  
  ref = this->pointer;
  segment = this->segment;
  capTable = this->capTable;
  local_14 = size;
  pPStack_10 = this;
  size_00 = assertMax<536870910u,unsigned_int,kj::ThrowOverflow>(size,&local_39);
  WireHelpers::initTextPointer(&local_38,ref,segment,capTable,size_00,(BuilderArena *)0x0);
  *(undefined8 *)__return_storage_ptr__ = local_38.value._0_8_;
  (__return_storage_ptr__->content).ptr = local_38.value.content.ptr;
  (__return_storage_ptr__->content).size_ = local_38.value.content.size_;
  return __return_storage_ptr__;
}

Assistant:

Text::Builder PointerBuilder::initBlob<Text>(ByteCount size) {
  return WireHelpers::initTextPointer(pointer, segment, capTable,
      assertMax<MAX_TEXT_SIZE>(size, ThrowOverflow())).value;
}